

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

int ipc_helper_bind_twice(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_buf_t local_28;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,&channel,1);
    if (iVar1 == 0) {
      uv_pipe_open(&channel,0);
      iVar1 = uv_is_readable((uv_stream_t *)&channel);
      if (iVar1 == 1) {
        iVar1 = uv_is_writable((uv_stream_t *)&channel);
        if (iVar1 == 1) {
          iVar1 = uv_is_closing((uv_handle_t *)&channel);
          if (iVar1 == 0) {
            local_28 = uv_buf_init("hello\n",6);
            puVar2 = uv_default_loop();
            iVar1 = uv_tcp_init(puVar2,&tcp_server);
            if (iVar1 == 0) {
              puVar2 = uv_default_loop();
              iVar1 = uv_tcp_init(puVar2,&tcp_server2);
              if (iVar1 == 0) {
                iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&addr,0);
                if (iVar1 == 0) {
                  iVar1 = uv_tcp_bind(&tcp_server2,(sockaddr *)&addr,0);
                  if (iVar1 == 0) {
                    iVar1 = uv_write2(&write_req,(uv_stream_t *)&channel,&local_28,1,
                                      (uv_stream_t *)&tcp_server,(uv_write_cb)0x0);
                    if (iVar1 == 0) {
                      iVar1 = uv_write2(&write_req2,(uv_stream_t *)&channel,&local_28,1,
                                        (uv_stream_t *)&tcp_server2,(uv_write_cb)0x0);
                      if (iVar1 == 0) {
                        puVar2 = uv_default_loop();
                        iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                        if (iVar1 == 0) {
                          puVar2 = uv_default_loop();
                          close_loop(puVar2);
                          puVar2 = uv_default_loop();
                          iVar1 = uv_loop_close(puVar2);
                          if (iVar1 == 0) {
                            return 0;
                          }
                          pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                          uVar3 = 0x3ac;
                        }
                        else {
                          pcVar4 = "r == 0";
                          uVar3 = 0x3aa;
                        }
                      }
                      else {
                        pcVar4 = "r == 0";
                        uVar3 = 0x3a7;
                      }
                    }
                    else {
                      pcVar4 = "r == 0";
                      uVar3 = 0x3a4;
                    }
                  }
                  else {
                    pcVar4 = "r == 0";
                    uVar3 = 0x3a0;
                  }
                }
                else {
                  pcVar4 = "r == 0";
                  uVar3 = 0x39e;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0x39b;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0x399;
            }
          }
          else {
            pcVar4 = "0 == uv_is_closing((uv_handle_t*) &channel)";
            uVar3 = 0x394;
          }
        }
        else {
          pcVar4 = "1 == uv_is_writable((uv_stream_t*) &channel)";
          uVar3 = 0x393;
        }
      }
      else {
        pcVar4 = "1 == uv_is_readable((uv_stream_t*) &channel)";
        uVar3 = 0x392;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x38e;
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uVar3 = 0x38b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

int ipc_helper_bind_twice(void) {
  /*
   * This is launched from test-ipc.c. stdin is a duplex channel
   * over which two handles will be transmitted.
   */
  struct sockaddr_in addr;
  int r;
  uv_buf_t buf;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  buf = uv_buf_init("hello\n", 6);

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);
  r = uv_tcp_init(uv_default_loop(), &tcp_server2);
  ASSERT(r == 0);

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_tcp_bind(&tcp_server2, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_write2(&write_req, (uv_stream_t*)&channel, &buf, 1,
                (uv_stream_t*)&tcp_server, NULL);
  ASSERT(r == 0);
  r = uv_write2(&write_req2, (uv_stream_t*)&channel, &buf, 1,
                (uv_stream_t*)&tcp_server2, NULL);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}